

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

void __thiscall Clasp::Solver::Dirty::cleanup(Dirty *this,EVP_PKEY_CTX *ctx)

{
  uint *puVar1;
  buf_type *pbVar2;
  pointer ppCVar3;
  Dirty *pDVar4;
  bool bVar5;
  uint uVar6;
  pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *ppVar7;
  long lVar8;
  uint uVar9;
  _func_int **pp_Var10;
  Constraint *pCVar11;
  long *in_RDX;
  Constraint **ppCVar12;
  Constraint **ppCVar13;
  long *plVar14;
  uint uVar15;
  Constraint *pCVar16;
  Constraint **first;
  uint *__tmp_1;
  Constraint *pCVar17;
  InSet IVar18;
  pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *ppVar19;
  InSet IVar20;
  buf_type *pbVar21;
  ulong uVar22;
  long lVar23;
  Constraint *pCVar24;
  _Hashtable<Clasp::Constraint_*,_Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>,_std::__detail::_Identity,_std::equal_to<Clasp::Constraint_*>,_std::hash<Clasp::Constraint_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *p_Var25;
  _Hashtable<Clasp::Constraint_*,_Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>,_std::__detail::_Identity,_std::equal_to<Clasp::Constraint_*>,_std::hash<Clasp::Constraint_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *p_Var26;
  Constraint **__it;
  GenericWatch *__tmp;
  ulong uVar27;
  _Hashtable<Clasp::Constraint_*,_Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>,_std::__detail::_Identity,_std::equal_to<Clasp::Constraint_*>,_std::hash<Clasp::Constraint_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *p_Var28;
  _Iter_pred<Clasp::(anonymous_namespace)::InSet> local_b0;
  Constraint **local_a8;
  uint local_9c;
  long *local_98;
  _Iter_pred<Clasp::(anonymous_namespace)::InSet> local_90;
  pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *local_88;
  InSet local_80;
  pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *local_78;
  Dirty *local_70;
  _Iter_pred<Clasp::(anonymous_namespace)::InSet> local_68;
  reverse_iterator<Clasp::GenericWatch_*> local_60;
  reverse_iterator<Clasp::GenericWatch_*> local_58;
  reverse_iterator<Clasp::GenericWatch_*> local_50;
  reverse_iterator<Clasp::GenericWatch_*> local_48;
  reverse_iterator<Clasp::GenericWatch_*> local_40;
  reverse_iterator<Clasp::GenericWatch_*> local_38;
  
  local_80.set = &this->cons;
  uVar15 = *(uint *)(ctx + 8);
  ppVar7 = (pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *)
           (this->dirty).super_type.super_left_right_rep<Clasp::Literal,_unsigned_int>.buf_;
  ppVar19 = (pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *)
            ((long)&(ppVar7->ebo_).buf +
            (ulong)(this->dirty).super_type.super_left_right_rep<Clasp::Literal,_unsigned_int>.left_
            );
  local_9c = uVar15;
  local_98 = in_RDX;
  local_88 = ppVar19;
  local_70 = this;
  while (ppVar7 != ppVar19) {
    uVar6 = *(uint *)&(ppVar7->ebo_).buf >> 1;
    local_78 = ppVar7;
    if (uVar6 < uVar15) {
      lVar8 = (ulong)uVar6 * 0x18;
      ppCVar12 = (Constraint **)(*(long *)ctx + lVar8);
      uVar6 = *(uint *)(*(long *)ctx + 0xc + lVar8);
      uVar27 = (ulong)uVar6;
      local_a8 = ppCVar12;
      if (7 < uVar27) {
        pp_Var10 = (*ppCVar12)->_vptr_Constraint;
        if ((((ulong)pp_Var10 & 1) != 0) &&
           (pp_Var10 = (_func_int **)((ulong)pp_Var10 & 0xfffffffffffffffe),
           (*ppCVar12)->_vptr_Constraint = pp_Var10, pp_Var10 != (_func_int **)0x0)) {
          pCVar17 = *ppCVar12;
          pCVar11 = (Constraint *)((long)&pCVar17->_vptr_Constraint + uVar27);
          local_90._M_pred.set = (InSet)(InSet)local_80.set;
          local_b0._M_pred.set = (InSet)(InSet)local_80.set;
          for (uVar22 = (ulong)(uVar6 >> 5); ppCVar12 = local_a8, pCVar16 = pCVar11,
              pCVar24 = pCVar17, 0 < (long)uVar22; uVar22 = uVar22 - 1) {
            bVar5 = __gnu_cxx::__ops::_Iter_pred<Clasp::(anonymous_namespace)::InSet>::operator()
                              (&local_b0,(ClauseWatch *)pCVar17);
            ppCVar12 = local_a8;
            if (bVar5) goto LAB_001667c1;
            bVar5 = __gnu_cxx::__ops::_Iter_pred<Clasp::(anonymous_namespace)::InSet>::operator()
                              (&local_b0,(ClauseWatch *)(pCVar17 + 1));
            ppCVar12 = local_a8;
            pCVar24 = pCVar17 + 1;
            if (bVar5) goto LAB_001667c1;
            bVar5 = __gnu_cxx::__ops::_Iter_pred<Clasp::(anonymous_namespace)::InSet>::operator()
                              (&local_b0,(ClauseWatch *)(pCVar17 + 2));
            ppCVar12 = local_a8;
            pCVar24 = pCVar17 + 2;
            if (bVar5) goto LAB_001667c1;
            bVar5 = __gnu_cxx::__ops::_Iter_pred<Clasp::(anonymous_namespace)::InSet>::operator()
                              (&local_b0,(ClauseWatch *)(pCVar17 + 3));
            ppCVar12 = local_a8;
            pCVar24 = pCVar17 + 3;
            if (bVar5) goto LAB_001667c1;
            pCVar17 = pCVar17 + 4;
            uVar27 = uVar27 - 0x20;
          }
          lVar8 = (long)uVar27 >> 3;
          if (lVar8 == 1) {
LAB_00166803:
            bVar5 = __gnu_cxx::__ops::_Iter_pred<Clasp::(anonymous_namespace)::InSet>::operator()
                              (&local_b0,(ClauseWatch *)pCVar17);
            ppVar19 = local_88;
            pCVar24 = pCVar17;
            if (bVar5) goto LAB_001667c1;
          }
          else {
            if (lVar8 == 2) {
LAB_001667a1:
              bVar5 = __gnu_cxx::__ops::_Iter_pred<Clasp::(anonymous_namespace)::InSet>::operator()
                                (&local_b0,(ClauseWatch *)pCVar17);
              pCVar24 = pCVar17;
              if (!bVar5) {
                pCVar17 = pCVar17 + 1;
                goto LAB_00166803;
              }
            }
            else {
              ppVar19 = local_88;
              if (lVar8 != 3) goto LAB_0016681a;
              bVar5 = __gnu_cxx::__ops::_Iter_pred<Clasp::(anonymous_namespace)::InSet>::operator()
                                (&local_b0,(ClauseWatch *)pCVar17);
              if (!bVar5) {
                pCVar17 = pCVar17 + 1;
                goto LAB_001667a1;
              }
            }
LAB_001667c1:
            ppVar19 = local_88;
            pCVar17 = pCVar24;
            if (pCVar24 != pCVar11) {
              while (pCVar16 = pCVar17, pCVar24 = pCVar24 + 1, pCVar24 != pCVar11) {
                bVar5 = __gnu_cxx::__ops::_Iter_pred<Clasp::(anonymous_namespace)::InSet>::
                        operator()(&local_90,(ClauseWatch *)pCVar24);
                pCVar17 = pCVar16;
                if (!bVar5) {
                  pCVar16->_vptr_Constraint = pCVar24->_vptr_Constraint;
                  pCVar17 = pCVar16 + 1;
                }
              }
            }
          }
LAB_0016681a:
          *(int *)((long)ppCVar12 + 0xc) = (int)pCVar16 - *(int *)ppCVar12;
          uVar15 = local_9c;
        }
      }
      uVar6 = *(uint *)(ppCVar12 + 2);
      uVar9 = *(uint *)(ppCVar12 + 1) & 0x7fffffff;
      if (0xf < uVar9 - uVar6) {
        uVar27 = *(ulong *)((long)&(*ppCVar12)[-2]._vptr_Constraint + (ulong)uVar9);
        if (((uVar27 & 1) != 0) &&
           (uVar27 = uVar27 & 0xfffffffffffffffe,
           *(ulong *)((long)&(*ppCVar12)[-2]._vptr_Constraint + (ulong)uVar9) = uVar27, uVar27 != 0)
           ) {
          IVar20.set = (ConstraintSet *)
                       ((long)&(*ppCVar12)->_vptr_Constraint +
                       (ulong)(*(uint *)(ppCVar12 + 1) & 0x7fffffff));
          p_Var25 = (_Hashtable<Clasp::Constraint_*,_Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>,_std::__detail::_Identity,_std::equal_to<Clasp::Constraint_*>,_std::hash<Clasp::Constraint_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)((long)&(*ppCVar12)->_vptr_Constraint + (ulong)uVar6);
          local_68._M_pred.set = (InSet)(InSet)local_80.set;
          local_b0._M_pred.set = (InSet)(InSet)local_80.set;
          lVar23 = (ulong)(*(uint *)(ppCVar12 + 1) & 0x7fffffff) - (ulong)uVar6;
          for (lVar8 = lVar23 >> 6; uVar15 = local_9c, p_Var26 = p_Var25, IVar18.set = IVar20.set,
              0 < lVar8; lVar8 = lVar8 + -1) {
            local_90._M_pred.set = (InSet)(InSet)IVar20.set;
            bVar5 = __gnu_cxx::__ops::_Iter_pred<Clasp::(anonymous_namespace)::InSet>::operator()
                              (&local_b0,(reverse_iterator<Clasp::GenericWatch_*> *)&local_90);
            ppCVar12 = local_a8;
            uVar15 = local_9c;
            if (bVar5) goto LAB_00166984;
            IVar18.set = (ConstraintSet *)&IVar20.set[-1]._M_h._M_rehash_policy._M_next_resize;
            local_38.current = (GenericWatch *)IVar18.set;
            bVar5 = __gnu_cxx::__ops::_Iter_pred<Clasp::(anonymous_namespace)::InSet>::operator()
                              (&local_b0,&local_38);
            ppCVar12 = local_a8;
            uVar15 = local_9c;
            if (bVar5) goto LAB_00166984;
            local_40.current = (GenericWatch *)&IVar20.set[-1]._M_h._M_element_count;
            bVar5 = __gnu_cxx::__ops::_Iter_pred<Clasp::(anonymous_namespace)::InSet>::operator()
                              (&local_b0,&local_40);
            ppCVar12 = local_a8;
            IVar18.set = (ConstraintSet *)&IVar20.set[-1]._M_h._M_element_count;
            uVar15 = local_9c;
            if (bVar5) goto LAB_00166984;
            local_48.current = (GenericWatch *)&IVar20.set[-1]._M_h._M_bucket_count;
            bVar5 = __gnu_cxx::__ops::_Iter_pred<Clasp::(anonymous_namespace)::InSet>::operator()
                              (&local_b0,&local_48);
            ppCVar12 = local_a8;
            IVar18.set = (ConstraintSet *)&IVar20.set[-1]._M_h._M_bucket_count;
            uVar15 = local_9c;
            if (bVar5) goto LAB_00166984;
            IVar20.set = (ConstraintSet *)&IVar20.set[-2]._M_h._M_single_bucket;
            lVar23 = lVar23 + -0x40;
          }
          lVar23 = lVar23 >> 4;
          if (lVar23 == 1) {
LAB_00166a14:
            local_60.current = (GenericWatch *)IVar20.set;
            bVar5 = __gnu_cxx::__ops::_Iter_pred<Clasp::(anonymous_namespace)::InSet>::operator()
                              (&local_b0,&local_60);
            IVar18.set = IVar20.set;
            if (!bVar5) {
              IVar18.set = (ConstraintSet *)p_Var25;
            }
LAB_00166984:
            p_Var28 = &(IVar18.set)->_M_h;
            if (&(IVar18.set)->_M_h != p_Var25) {
              do {
                IVar20.set = (ConstraintSet *)
                             &(&(IVar18.set)->_M_h)[-1]._M_rehash_policy._M_next_resize;
                do {
                  IVar18.set = IVar20.set;
                  p_Var26 = p_Var28;
                  if (&(IVar18.set)->_M_h == p_Var25) goto LAB_001669cf;
                  local_b0._M_pred.set = (InSet)(InSet)IVar18.set;
                  bVar5 = __gnu_cxx::__ops::_Iter_pred<Clasp::(anonymous_namespace)::InSet>::
                          operator()(&local_68,(reverse_iterator<Clasp::GenericWatch_*> *)&local_b0)
                  ;
                  IVar20.set = (ConstraintSet *)&IVar18.set[-1]._M_h._M_rehash_policy._M_next_resize
                  ;
                } while (bVar5);
                *(undefined4 *)&p_Var28[-1]._M_single_bucket =
                     *(undefined4 *)&IVar18.set[-1]._M_h._M_single_bucket;
                p_Var28[-1]._M_rehash_policy._M_next_resize = *(size_t *)IVar20.set;
                p_Var28 = (_Hashtable<Clasp::Constraint_*,_Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>,_std::__detail::_Identity,_std::equal_to<Clasp::Constraint_*>,_std::hash<Clasp::Constraint_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           *)&p_Var28[-1]._M_rehash_policy._M_next_resize;
              } while( true );
            }
          }
          else {
            if (lVar23 == 2) {
LAB_001669f2:
              local_58.current = (GenericWatch *)IVar20.set;
              bVar5 = __gnu_cxx::__ops::_Iter_pred<Clasp::(anonymous_namespace)::InSet>::operator()
                                (&local_b0,&local_58);
              IVar18.set = IVar20.set;
              if (!bVar5) {
                IVar20.set = (ConstraintSet *)
                             &(&(IVar20.set)->_M_h)[-1]._M_rehash_policy._M_next_resize;
                goto LAB_00166a14;
              }
              goto LAB_00166984;
            }
            if (lVar23 == 3) {
              local_50.current = (GenericWatch *)IVar20.set;
              bVar5 = __gnu_cxx::__ops::_Iter_pred<Clasp::(anonymous_namespace)::InSet>::operator()
                                (&local_b0,&local_50);
              if (!bVar5) {
                IVar20.set = (ConstraintSet *)&IVar20.set[-1]._M_h._M_rehash_policy._M_next_resize;
                goto LAB_001669f2;
              }
              goto LAB_00166984;
            }
          }
LAB_001669cf:
          *(int *)(ppCVar12 + 2) = (int)p_Var26 - *(int *)ppCVar12;
          ppVar19 = local_88;
        }
      }
    }
    ppVar7 = (pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *)
             ((long)&(local_78->ebo_).buf + 4);
  }
  pbVar2 = (local_70->dirty).super_type.super_left_right_rep<Clasp::Literal,_unsigned_int>.buf_;
  pbVar21 = pbVar2 + (*(uint *)&(local_70->dirty).super_type.
                                super_left_right_rep<Clasp::Literal,_unsigned_int>.field_0x8 &
                     0x7fffffff);
  uVar15 = (local_70->dirty).super_type.super_left_right_rep<Clasp::Literal,_unsigned_int>.right_;
  plVar14 = local_98;
  do {
    do {
      do {
        do {
          pDVar4 = local_70;
          if (pbVar21 == pbVar2 + uVar15) {
            uVar15 = *(uint *)&(local_70->dirty).super_type.
                               super_left_right_rep<Clasp::Literal,_unsigned_int>.field_0x8;
            (local_70->dirty).super_type.super_left_right_rep<Clasp::Literal,_unsigned_int>.left_ =
                 0;
            (local_70->dirty).super_type.super_left_right_rep<Clasp::Literal,_unsigned_int>.right_ =
                 uVar15 & 0x7fffffff;
            std::
            _Hashtable<Clasp::Constraint_*,_Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>,_std::__detail::_Identity,_std::equal_to<Clasp::Constraint_*>,_std::hash<Clasp::Constraint_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::clear(&(local_80.set)->_M_h);
            pDVar4->last = (Constraint *)0x0;
            return;
          }
          puVar1 = (uint *)(pbVar21 + -4);
          pbVar21 = pbVar21 + -4;
        } while (*(uint *)(plVar14 + 1) <= *puVar1);
        ppVar7 = *(pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> **)
                  (*plVar14 + 8 + (ulong)*puVar1 * 0x10);
        uVar6 = (ppVar7->ebo_).size;
        uVar27 = (ulong)uVar6;
      } while (uVar27 == 0);
      ppCVar3 = (ppVar7->ebo_).buf;
      pCVar11 = *ppCVar3;
    } while ((((ulong)pCVar11 & 1) == 0) ||
            (pCVar11 = (Constraint *)((ulong)pCVar11 & 0xfffffffffffffffe), *ppCVar3 = pCVar11,
            pCVar11 == (Constraint *)0x0));
    ppCVar12 = (ppVar7->ebo_).buf;
    local_a8 = ppCVar12 + uVar27;
    local_90._M_pred.set = (InSet)(InSet)local_80.set;
    local_b0._M_pred.set = (InSet)(InSet)local_80.set;
    lVar8 = uVar27 << 3;
    local_78 = ppVar7;
    for (uVar27 = (ulong)(uVar6 >> 2); plVar14 = local_98, ppCVar13 = ppCVar12, 0 < (long)uVar27;
        uVar27 = uVar27 - 1) {
      bVar5 = __gnu_cxx::__ops::_Iter_pred<Clasp::(anonymous_namespace)::InSet>::operator()
                        (&local_b0,ppCVar12);
      plVar14 = local_98;
      if (bVar5) goto LAB_00166b8f;
      bVar5 = __gnu_cxx::__ops::_Iter_pred<Clasp::(anonymous_namespace)::InSet>::operator()
                        (&local_b0,ppCVar12 + 1);
      plVar14 = local_98;
      ppCVar13 = ppCVar12 + 1;
      if (bVar5) goto LAB_00166b8f;
      bVar5 = __gnu_cxx::__ops::_Iter_pred<Clasp::(anonymous_namespace)::InSet>::operator()
                        (&local_b0,ppCVar12 + 2);
      plVar14 = local_98;
      ppCVar13 = ppCVar12 + 2;
      if (bVar5) goto LAB_00166b8f;
      bVar5 = __gnu_cxx::__ops::_Iter_pred<Clasp::(anonymous_namespace)::InSet>::operator()
                        (&local_b0,ppCVar12 + 3);
      plVar14 = local_98;
      ppCVar13 = ppCVar12 + 3;
      if (bVar5) goto LAB_00166b8f;
      ppCVar12 = ppCVar12 + 4;
      lVar8 = lVar8 + -0x20;
    }
    lVar8 = lVar8 >> 3;
    if (lVar8 == 1) {
LAB_00166be4:
      bVar5 = __gnu_cxx::__ops::_Iter_pred<Clasp::(anonymous_namespace)::InSet>::operator()
                        (&local_b0,ppCVar12);
      first = local_a8;
      ppCVar13 = ppCVar12;
      if (bVar5) goto LAB_00166b8f;
    }
    else {
      if (lVar8 == 2) {
LAB_00166b73:
        bVar5 = __gnu_cxx::__ops::_Iter_pred<Clasp::(anonymous_namespace)::InSet>::operator()
                          (&local_b0,ppCVar13);
        if (!bVar5) {
          ppCVar12 = ppCVar13 + 1;
          goto LAB_00166be4;
        }
      }
      else {
        first = local_a8;
        if (lVar8 != 3) goto LAB_00166bff;
        bVar5 = __gnu_cxx::__ops::_Iter_pred<Clasp::(anonymous_namespace)::InSet>::operator()
                          (&local_b0,ppCVar12);
        if (!bVar5) {
          ppCVar13 = ppCVar12 + 1;
          goto LAB_00166b73;
        }
      }
LAB_00166b8f:
      ppCVar12 = local_a8;
      first = local_a8;
      if (ppCVar13 != local_a8) {
        __it = ppCVar13;
        while (__it = __it + 1, plVar14 = local_98, first = ppCVar13, __it != ppCVar12) {
          bVar5 = __gnu_cxx::__ops::_Iter_pred<Clasp::(anonymous_namespace)::InSet>::operator()
                            (&local_90,__it);
          if (!bVar5) {
            *ppCVar13 = *__it;
            ppCVar13 = ppCVar13 + 1;
          }
        }
      }
    }
LAB_00166bff:
    bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::erase
              (local_78,first,(local_78->ebo_).buf + (local_78->ebo_).size);
  } while( true );
}

Assistant:

void cleanup(Watches& watches, DecisionLevels& levels) {
		InSet inCons = { &cons };
		const uint32 maxId = (uint32)watches.size();
		for (DirtyList::left_iterator it = dirty.left_begin(), end = dirty.left_end(); it != end; ++it) {
			uint32 id = it->id();
			if (id >= maxId)
				continue;
			WatchList& wl = watches[id];
			if (wl.left_size() && test_and_clear(wl.left_begin()->head)) { wl.shrink_left(std::remove_if(wl.left_begin(), wl.left_end(), inCons)); }
			if (wl.right_size()&& test_and_clear(wl.right_begin()->con)) { wl.shrink_right(std::remove_if(wl.right_begin(), wl.right_end(), inCons)); }
		}
		ConstraintDB* db = 0;
		for (DirtyList::right_iterator it = dirty.right_begin(), end = dirty.right_end(); it != end; ++it) {
			if (*it < levels.size() && !(db = levels[*it].undo)->empty() && test_and_clear(*db->begin())) {
				db->erase(std::remove_if(db->begin(), db->end(), inCons), db->end());
			}
		}
		dirty.clear();
		cons.clear();
		last = 0;
	}